

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O1

NodeRefPtr<4> __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>::
operator()(CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined4 *puVar3;
  uint uVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  size_t sVar20;
  undefined1 *puVar21;
  long lVar22;
  unsigned_long uVar23;
  ulong uVar24;
  long lVar25;
  uint *puVar26;
  ulong uVar27;
  long lVar28;
  vuint<4> vprimID;
  MutexSys *local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  PrimRef *local_f8;
  ulong local_f0;
  MutexSys *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ThreadLocal2 *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ThreadLocal2 *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  long local_58;
  CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>
  *local_50;
  uint local_48 [6];
  
  uVar18 = range->_begin;
  uVar27 = range->_end;
  if (uVar18 < uVar27) {
    puVar21 = (undefined1 *)((long)&prims[uVar18].lower.field_0 + 0xc);
    do {
      puVar21[3] = puVar21[3] & 7;
      uVar18 = uVar18 + 1;
      uVar27 = range->_end;
      puVar21 = puVar21 + 0x20;
    } while (uVar18 < uVar27);
  }
  uVar23 = range->_begin;
  uVar18 = (uVar27 - uVar23) + 3;
  local_f0 = uVar18 >> 2;
  local_108 = (MutexSys *)(local_f0 * 0xb0);
  this_00 = (alloc.talloc1)->parent;
  local_f8 = prims;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_b8 = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_e8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = CONCAT71(uStack_e0._1_7_,1);
    local_88 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,&local_88);
    }
    else {
      *__position._M_current = local_88;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if ((char)uStack_e0 == '\x01') {
      MutexSys::unlock(local_e8);
    }
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  (alloc.talloc1)->bytesUsed = (long)&local_108->mutex + (alloc.talloc1)->bytesUsed;
  sVar20 = (alloc.talloc1)->cur;
  uVar24 = (ulong)(-(int)sVar20 & 0xf);
  uVar27 = (long)&local_108->mutex + uVar24 + sVar20;
  (alloc.talloc1)->cur = uVar27;
  if ((alloc.talloc1)->end < uVar27) {
    (alloc.talloc1)->cur = sVar20;
    if ((MutexSys *)(alloc.talloc1)->allocBlockSize < (MutexSys *)((long)local_108 << 2)) {
      pcVar17 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_108);
    }
    else {
      local_e8 = (MutexSys *)(alloc.talloc1)->allocBlockSize;
      pcVar17 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
      (alloc.talloc1)->ptr = pcVar17;
      sVar20 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
      (alloc.talloc1)->bytesWasted = sVar20;
      (alloc.talloc1)->cur = 0;
      (alloc.talloc1)->end = (size_t)local_e8;
      (alloc.talloc1)->cur = (size_t)local_108;
      if (local_e8 < local_108) {
        (alloc.talloc1)->cur = 0;
        local_e8 = (MutexSys *)(alloc.talloc1)->allocBlockSize;
        pcVar17 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
        (alloc.talloc1)->ptr = pcVar17;
        sVar20 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar20;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = (size_t)local_e8;
        (alloc.talloc1)->cur = (size_t)local_108;
        if (local_e8 < local_108) {
          (alloc.talloc1)->cur = 0;
          pcVar17 = (char *)0x0;
        }
        else {
          (alloc.talloc1)->bytesWasted = sVar20;
        }
      }
      else {
        (alloc.talloc1)->bytesWasted = sVar20;
      }
    }
  }
  else {
    (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar24;
    pcVar17 = (alloc.talloc1)->ptr + (uVar27 - (long)local_108);
  }
  if (3 < uVar18) {
    lVar25 = local_f0 + (local_f0 == 0);
    local_f8 = (PrimRef *)((long)&(local_f8->upper).field_0 + 0xc);
    lVar22 = 0;
    local_58 = lVar25;
    local_50 = this;
    do {
      uVar18 = range->_end;
      local_108 = (MutexSys *)0xffffffffffffffff;
      uStack_100 = 0xffffffff;
      uStack_fc = 0xffffffff;
      local_48[0] = 0xffffffff;
      local_48[1] = 0xffffffff;
      local_48[2] = 0xffffffff;
      local_48[3] = 0xffffffff;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = (MutexSys *)0x0;
      uStack_e0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = (ThreadLocal2 *)0x0;
      uStack_b0 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = (ThreadLocal2 *)0x0;
      uStack_80 = 0;
      if (uVar23 < uVar18) {
        lVar25 = *(long *)(*(long *)(*(long *)this + 0x68) + 0x1e8);
        puVar26 = (uint *)((long)local_f8 + uVar23 * 0x20);
        uVar27 = 0;
        do {
          uVar4 = *puVar26;
          lVar5 = *(long *)(lVar25 + (ulong)puVar26[-4] * 8);
          lVar28 = (ulong)uVar4 * *(long *)(lVar5 + 0x68);
          lVar6 = *(long *)(lVar5 + 0x58);
          lVar7 = *(long *)(lVar5 + 0x90);
          lVar5 = *(long *)(lVar5 + 0xa0);
          puVar3 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + lVar28) * lVar5);
          uVar8 = *puVar3;
          uVar9 = puVar3[1];
          uVar10 = puVar3[2];
          puVar3 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 4 + lVar28) * lVar5);
          uVar11 = *puVar3;
          uVar12 = puVar3[1];
          uVar13 = puVar3[2];
          puVar3 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 8 + lVar28) * lVar5);
          uVar14 = *puVar3;
          uVar15 = puVar3[1];
          uVar16 = puVar3[2];
          *(uint *)((long)&local_108 + uVar27 * 4) = puVar26[-4];
          local_48[uVar27] = uVar4;
          *(undefined4 *)((long)&local_e8 + uVar27 * 4) = uVar8;
          *(undefined4 *)((long)&local_d8 + uVar27 * 4) = uVar9;
          *(undefined4 *)((long)&local_c8 + uVar27 * 4) = uVar10;
          *(undefined4 *)((long)&local_b8 + uVar27 * 4) = uVar11;
          *(undefined4 *)((long)&local_a8 + uVar27 * 4) = uVar12;
          *(undefined4 *)((long)&local_98 + uVar27 * 4) = uVar13;
          *(undefined4 *)((long)&local_88 + uVar27 * 4) = uVar14;
          *(undefined4 *)((long)&local_78 + uVar27 * 4) = uVar15;
          *(undefined4 *)((long)&local_68 + uVar27 * 4) = uVar16;
          uVar24 = uVar27 + 1;
          if (2 < uVar27) break;
          lVar5 = uVar27 + uVar23;
          puVar26 = puVar26 + 8;
          uVar27 = uVar24;
        } while (lVar5 + 1U < uVar18);
        uVar23 = uVar23 + uVar24;
        lVar25 = local_58;
        this = local_50;
      }
      pcVar19 = pcVar17 + lVar22 * 0xb0;
      *(MutexSys **)pcVar19 = local_e8;
      *(undefined8 *)(pcVar19 + 8) = uStack_e0;
      *(undefined8 *)(pcVar19 + 0x10) = local_d8;
      *(undefined8 *)(pcVar19 + 0x18) = uStack_d0;
      *(undefined8 *)(pcVar19 + 0x20) = local_c8;
      *(undefined8 *)(pcVar19 + 0x28) = uStack_c0;
      *(ThreadLocal2 **)(pcVar19 + 0x30) = local_b8;
      *(undefined8 *)(pcVar19 + 0x38) = uStack_b0;
      *(undefined8 *)(pcVar19 + 0x40) = local_a8;
      *(undefined8 *)(pcVar19 + 0x48) = uStack_a0;
      *(undefined8 *)(pcVar19 + 0x50) = local_98;
      *(undefined8 *)(pcVar19 + 0x58) = uStack_90;
      *(ThreadLocal2 **)(pcVar19 + 0x60) = local_88;
      *(undefined8 *)(pcVar19 + 0x68) = uStack_80;
      *(undefined8 *)(pcVar19 + 0x70) = local_78;
      *(undefined8 *)(pcVar19 + 0x78) = uStack_70;
      *(undefined8 *)(pcVar19 + 0x80) = local_68;
      *(undefined8 *)(pcVar19 + 0x88) = uStack_60;
      *(MutexSys **)(pcVar19 + 0x90) = local_108;
      *(ulong *)(pcVar19 + 0x98) = CONCAT44(uStack_fc,uStack_100);
      *(ulong *)(pcVar19 + 0xa0) = CONCAT44(local_48[1],local_48[0]);
      *(ulong *)(pcVar19 + 0xa8) = CONCAT44(local_48[3],local_48[2]);
      lVar22 = lVar22 + 1;
    } while (lVar22 != lVar25);
  }
  uVar18 = 7;
  if (local_f0 < 7) {
    uVar18 = local_f0;
  }
  return (NodeRefPtr<4>)(uVar18 | (ulong)pcVar17 | 8);
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }